

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseSubExpression
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options,int precedence)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token operatorToken;
  bool bVar1;
  SyntaxKind kind;
  TimingControlSyntax *timing;
  ExpressionSyntax *expr_00;
  TimingControlExpressionSyntax *lhs;
  SyntaxNode *this_00;
  NameSyntax *newKeyword;
  Token TVar2;
  Token member_00;
  Token TVar3;
  AttrList AVar4;
  bitmask<slang::parsing::detail::ExpressionOptions> local_178;
  underlying_type local_174;
  underlying_type local_170;
  underlying_type local_16c;
  ExpressionSyntax *local_168;
  pointer ppAStack_160;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_158;
  size_type local_128;
  Info *pIStack_120;
  underlying_type local_114;
  ExpressionSyntax *local_110;
  ExpressionSyntax *postfix;
  ExpressionSyntax *local_100;
  ExpressionSyntax *operand;
  AttrList attributes;
  Token opToken;
  PrefixUnaryExpressionSyntax *pPStack_d0;
  SyntaxKind opKind;
  ExpressionSyntax *leftOperand;
  TokenKind local_a0;
  ExpressionSyntax *local_90;
  ExpressionSyntax *expr_1;
  Token member;
  Token tagged;
  TimingControlExpressionSyntax *expr;
  TimingControlSyntax *timingControl;
  TokenKind local_40;
  Token current;
  DepthGuard dg;
  int precedence_local;
  Parser *this_local;
  TaggedUnionExpressionSyntax *pTStack_10;
  bitmask<slang::parsing::detail::ExpressionOptions> options_local;
  
  this_local._4_4_ = options.m_bits;
  setDepthGuard((Parser *)&current.info);
  TVar2 = ParserBase::peek(&this->super_ParserBase);
  current._0_8_ = TVar2.info;
  local_40 = TVar2.kind;
  bVar1 = slang::syntax::SyntaxFacts::isPossibleDelayOrEventControl(local_40);
  if (bVar1) {
    timing = parseTimingControl(this);
    if (timing == (TimingControlSyntax *)0x0) {
      assert::assertFailed
                ("timingControl",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Parser_expressions.cpp"
                 ,0x38,
                 "ExpressionSyntax &slang::parsing::Parser::parseSubExpression(bitmask<ExpressionOptions>, int)"
                );
    }
    expr_00 = parseExpression(this);
    lhs = slang::syntax::SyntaxFactory::timingControlExpression(&this->factory,timing,expr_00);
    pTStack_10 = (TaggedUnionExpressionSyntax *)
                 parsePostfixExpression(this,&lhs->super_ExpressionSyntax,this_local._4_4_);
  }
  else if (local_40 == TaggedKeyword) {
    TVar2 = ParserBase::consume(&this->super_ParserBase);
    member_00 = ParserBase::expect(&this->super_ParserBase,Identifier);
    local_90 = (ExpressionSyntax *)0x0;
    TVar3 = ParserBase::peek(&this->super_ParserBase);
    local_a0 = TVar3.kind;
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(local_a0);
    if (bVar1) {
      local_90 = parseExpression(this);
    }
    pTStack_10 = slang::syntax::SyntaxFactory::taggedUnionExpression
                           (&this->factory,TVar2,member_00,local_90);
  }
  else {
    kind = slang::syntax::SyntaxFacts::getUnaryPrefixExpression(local_40);
    if (kind == Unknown) {
      local_16c = this_local._4_4_;
      this_00 = &parsePrimaryExpression(this,this_local._4_4_)->super_SyntaxNode;
      bVar1 = isNewExpr((ExpressionSyntax *)this_00);
      if (bVar1) {
        newKeyword = slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(this_00);
        local_170 = this_local._4_4_;
        pTStack_10 = (TaggedUnionExpressionSyntax *)
                     parseNewExpression(this,newKeyword,this_local._4_4_);
        goto LAB_0056271a;
      }
      local_174 = this_local._4_4_;
      pPStack_d0 = (PrefixUnaryExpressionSyntax *)
                   parsePostfixExpression(this,(ExpressionSyntax *)this_00,this_local._4_4_);
    }
    else {
      TVar2 = ParserBase::consume(&this->super_ParserBase);
      attributes.size_ = TVar2._0_8_;
      AVar4 = parseAttributes(this);
      attributes.data_ = (pointer)AVar4.size_;
      operand = (ExpressionSyntax *)AVar4.data_;
      postfix._4_4_ = this_local._4_4_;
      local_100 = parsePrimaryExpression(this,this_local._4_4_);
      local_114 = this_local._4_4_;
      local_110 = parsePostfixExpression(this,local_100,this_local._4_4_);
      local_128 = attributes.size_;
      local_168 = operand;
      ppAStack_160 = attributes.data_;
      elements.size_ = (size_type)attributes.data_;
      elements.data_ = (pointer)operand;
      pIStack_120 = TVar2.info;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                (&local_158,elements);
      operatorToken.info = pIStack_120;
      operatorToken.kind = (undefined2)local_128;
      operatorToken._2_1_ = local_128._2_1_;
      operatorToken.numFlags.raw = local_128._3_1_;
      operatorToken.rawLen = local_128._4_4_;
      pPStack_d0 = slang::syntax::SyntaxFactory::prefixUnaryExpression
                             (&this->factory,kind,operatorToken,&local_158,local_110);
    }
    local_178 = parsing::detail::operator~(AllowSuperNewCall);
    bitmask<slang::parsing::detail::ExpressionOptions>::operator&=
              ((bitmask<slang::parsing::detail::ExpressionOptions> *)((long)&this_local + 4),
               &local_178);
    pTStack_10 = (TaggedUnionExpressionSyntax *)
                 parseBinaryExpression
                           (this,&pPStack_d0->super_ExpressionSyntax,this_local._4_4_,precedence);
  }
LAB_0056271a:
  DepthGuard::~DepthGuard((DepthGuard *)&current.info);
  return &pTStack_10->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseSubExpression(bitmask<ExpressionOptions> options, int precedence) {
    auto dg = setDepthGuard();

    auto current = peek();
    if (isPossibleDelayOrEventControl(current.kind)) {
        auto timingControl = parseTimingControl();
        ASSERT(timingControl);

        auto& expr = factory.timingControlExpression(*timingControl, parseExpression());
        return parsePostfixExpression(expr, options);
    }
    else if (current.kind == TokenKind::TaggedKeyword) {
        auto tagged = consume();
        auto member = expect(TokenKind::Identifier);

        ExpressionSyntax* expr = nullptr;
        if (isPossibleExpression(peek().kind))
            expr = &parseExpression();

        return factory.taggedUnionExpression(tagged, member, expr);
    }

    ExpressionSyntax* leftOperand;
    SyntaxKind opKind = getUnaryPrefixExpression(current.kind);
    if (opKind != SyntaxKind::Unknown) {
        auto opToken = consume();
        auto attributes = parseAttributes();

        auto& operand = parsePrimaryExpression(options);
        auto& postfix = parsePostfixExpression(operand, options);
        leftOperand = &factory.prefixUnaryExpression(opKind, opToken, attributes, postfix);
    }
    else {
        leftOperand = &parsePrimaryExpression(options);

        // If the primary is a new or scoped new operator we should handle
        // that separately (it doesn't participate in postfix expression parsing).
        if (isNewExpr(leftOperand))
            return parseNewExpression(leftOperand->as<NameSyntax>(), options);

        leftOperand = &parsePostfixExpression(*leftOperand, options);
    }

    options &= ~ExpressionOptions::AllowSuperNewCall;
    return parseBinaryExpression(leftOperand, options, precedence);
}